

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void fix_diff_subtract(saucy *s,int cf,int *a,int *b)

{
  int iVar1;
  int iVar2;
  int cb;
  int k;
  int i;
  int *b_local;
  int *a_local;
  int cf_local;
  saucy *s_local;
  
  iVar2 = cf + (s->right).clen[cf];
  for (cb = cf; iVar1 = cf, cb <= iVar2; cb = cb + 1) {
    s->stuff[a[cb]] = '\x01';
  }
  while (cb = iVar1, iVar1 = cf, cb <= iVar2) {
    if (s->stuff[b[cb]] == '\0') {
      add_diff(s,b[cb]);
    }
    iVar1 = cb + 1;
  }
  while (cb = iVar1, cb <= iVar2) {
    s->stuff[a[cb]] = '\0';
    iVar1 = cb + 1;
  }
  return;
}

Assistant:

static void
fix_diff_subtract(struct saucy *s, int cf, const int *a, const int *b)
{
    int i, k;
    int cb = cf + s->right.clen[cf];

    /* Mark the contents of the first set */
    for (i = cf; i <= cb; ++i) {
        s->stuff[a[i]] = 1;
    }

    /* Add elements from second set not present in the first */
    for (i = cf; i <= cb; ++i) {
        k = b[i];
        if (!s->stuff[k]) add_diff(s, k);
    }

    /* Clear the marks of the first set */
    for (i = cf; i <= cb; ++i) {
        s->stuff[a[i]] = 0;
    }
}